

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_std(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  ulong uVar1;
  ulong uVar2;
  TCGv_i64 val;
  uint32_t uVar3;
  TCGMemOpIdx TVar4;
  uint32_t uVar5;
  TCGv_i64 EA_00;
  TCGv_i32 ret;
  TCGv_i64 pTVar6;
  TCGv_i32 oi;
  TCGv_i64 lo;
  TCGv_i64 hi;
  _Bool le_is_supported;
  _Bool legal_in_user_mode;
  TCGv_i64 EA;
  int rs;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar3 = rS(ctx->opcode);
  if ((ctx->opcode & 3) == 2) {
    uVar1 = ctx->insns_flags2;
    uVar2 = ctx->insns_flags2;
    if ((ctx->insns_flags & 0x40) == 0) {
      gen_inval_exception(ctx,1);
    }
    if (((uVar1 & 0x2000) == 0) && ((ctx->pr & 1U) != 0)) {
      gen_priv_exception(ctx,1);
    }
    else if (((uVar2 & 0x2000) == 0) && ((ctx->le_mode & 1U) != 0)) {
      gen_align_no_le(ctx);
    }
    else if ((uVar3 & 1) == 0) {
      gen_set_access_type(ctx,0x20);
      EA_00 = tcg_temp_new_i64(tcg_ctx_00);
      gen_addr_imm_index(ctx,EA_00,3);
      pTVar6 = cpu_gpr[(int)(uVar3 + 1)];
      val = cpu_gpr[(int)uVar3];
      uVar3 = tb_cflags((ctx->base).tb);
      if ((uVar3 & 0x80000) == 0) {
        if ((ctx->le_mode & 1U) == 0) {
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,val,EA_00,(long)ctx->mem_idx,MO_BEQ);
          gen_addr_add(ctx,EA_00,EA_00,8);
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,pTVar6,EA_00,(long)ctx->mem_idx,MO_BEQ);
        }
        else {
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,pTVar6,EA_00,(long)ctx->mem_idx,MO_64);
          gen_addr_add(ctx,EA_00,EA_00,8);
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,val,EA_00,(long)ctx->mem_idx,MO_64);
        }
      }
      else {
        ret = tcg_temp_new_i32(tcg_ctx_00);
        if ((ctx->le_mode & 1U) == 0) {
          TVar4 = make_memop_idx(MO_BEQ,ctx->mem_idx);
          tcg_gen_movi_i32(tcg_ctx_00,ret,TVar4);
          gen_helper_stq_be_parallel(tcg_ctx_00,tcg_ctx_00->cpu_env,EA_00,pTVar6,val,ret);
        }
        else {
          TVar4 = make_memop_idx(MO_64,ctx->mem_idx);
          tcg_gen_movi_i32(tcg_ctx_00,ret,TVar4);
          gen_helper_stq_le_parallel(tcg_ctx_00,tcg_ctx_00->cpu_env,EA_00,pTVar6,val,ret);
        }
        tcg_temp_free_i32(tcg_ctx_00,ret);
      }
      tcg_temp_free_i64(tcg_ctx_00,EA_00);
    }
    else {
      gen_inval_exception(ctx,1);
    }
  }
  else {
    uVar5 = Rc(ctx->opcode);
    if ((uVar5 == 0) || (uVar5 = rA(ctx->opcode), uVar5 != 0)) {
      gen_set_access_type(ctx,0x20);
      pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
      gen_addr_imm_index(ctx,pTVar6,3);
      gen_qemu_st64_i64(ctx,cpu_gpr[(int)uVar3],pTVar6);
      uVar3 = Rc(ctx->opcode);
      if (uVar3 != 0) {
        uVar3 = rA(ctx->opcode);
        tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar3],pTVar6);
      }
      tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    }
    else {
      gen_inval_exception(ctx,1);
    }
  }
  return;
}

Assistant:

static void gen_std(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs;
    TCGv EA;

    rs = rS(ctx->opcode);
    if ((ctx->opcode & 0x3) == 0x2) { /* stq */
        bool legal_in_user_mode = (ctx->insns_flags2 & PPC2_LSQ_ISA207) != 0;
        bool le_is_supported = (ctx->insns_flags2 & PPC2_LSQ_ISA207) != 0;
        TCGv hi, lo;

        if (!(ctx->insns_flags & PPC_64BX)) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        }

        if (!legal_in_user_mode && ctx->pr) {
            gen_priv_exception(ctx, POWERPC_EXCP_PRIV_OPC);
            return;
        }

        if (!le_is_supported && ctx->le_mode) {
            gen_align_no_le(ctx);
            return;
        }

        if (unlikely(rs & 1)) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
            return;
        }
        gen_set_access_type(ctx, ACCESS_INT);
        EA = tcg_temp_new(tcg_ctx);
        gen_addr_imm_index(ctx, EA, 0x03);

        /* Note that the low part is always in RS+1, even in LE mode.  */
        lo = cpu_gpr[rs + 1];
        hi = cpu_gpr[rs];

        if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
            if (HAVE_ATOMIC128) {
                TCGv_i32 oi = tcg_temp_new_i32(tcg_ctx);
                if (ctx->le_mode) {
                    tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_LEQ, ctx->mem_idx));
                    gen_helper_stq_le_parallel(tcg_ctx, tcg_ctx->cpu_env, EA, lo, hi, oi);
                } else {
                    tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_BEQ, ctx->mem_idx));
                    gen_helper_stq_be_parallel(tcg_ctx, tcg_ctx->cpu_env, EA, lo, hi, oi);
                }
                tcg_temp_free_i32(tcg_ctx, oi);
            } else {
                /* Restart with exclusive lock.  */
                gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
                ctx->base.is_jmp = DISAS_NORETURN;
            }
        } else if (ctx->le_mode) {
            tcg_gen_qemu_st_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_LEQ);
            gen_addr_add(ctx, EA, EA, 8);
            tcg_gen_qemu_st_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_LEQ);
        } else {
            tcg_gen_qemu_st_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_BEQ);
            gen_addr_add(ctx, EA, EA, 8);
            tcg_gen_qemu_st_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_BEQ);
        }
        tcg_temp_free(tcg_ctx, EA);
    } else {
        /* std / stdu */
        if (Rc(ctx->opcode)) {
            if (unlikely(rA(ctx->opcode) == 0)) {
                gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
                return;
            }
        }
        gen_set_access_type(ctx, ACCESS_INT);
        EA = tcg_temp_new(tcg_ctx);
        gen_addr_imm_index(ctx, EA, 0x03);
        gen_qemu_st64_i64(ctx, cpu_gpr[rs], EA);
        if (Rc(ctx->opcode)) {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], EA);
        }
        tcg_temp_free(tcg_ctx, EA);
    }
}